

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_decoder.cpp
# Opt level: O0

AbbrevDesc * __thiscall
LLVMBC::BitcodeReader::getAbbrev(BitcodeReader *this,uint32_t blockId,uint32_t abbrevID)

{
  mapped_type this_00;
  bool bVar1;
  mapped_type *ppBVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference ppBVar6;
  reference pvVar7;
  BlockInfo *info;
  uint32_t abbrevID_local;
  uint32_t blockId_local;
  BitcodeReader *this_local;
  
  info._0_4_ = abbrevID;
  info._4_4_ = blockId;
  _abbrevID_local = this;
  ppBVar2 = std::
            unordered_map<unsigned_int,_LLVMBC::BlockInfo_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_LLVMBC::BlockInfo_*>_>_>
            ::operator[](&this->blockInfo,(key_type *)((long)&info + 4));
  this_00 = *ppBVar2;
  if ((uint32_t)info < 4) {
    __assert_fail("abbrevID >= APPLICATION_ABBREV",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_decoder.cpp"
                  ,0x13a,"const AbbrevDesc &LLVMBC::BitcodeReader::getAbbrev(uint32_t, uint32_t)");
  }
  info._0_4_ = (uint32_t)info - 4;
  if (this_00 != (mapped_type)0x0) {
    uVar3 = (ulong)(uint32_t)info;
    sVar4 = std::vector<LLVMBC::AbbrevDesc,_dxil_spv::ThreadLocalAllocator<LLVMBC::AbbrevDesc>_>::
            size(&this_00->abbrevs);
    if (uVar3 < sVar4) {
      pvVar5 = std::vector<LLVMBC::AbbrevDesc,_dxil_spv::ThreadLocalAllocator<LLVMBC::AbbrevDesc>_>
               ::operator[](&this_00->abbrevs,(ulong)(uint32_t)info);
      return pvVar5;
    }
    sVar4 = std::vector<LLVMBC::AbbrevDesc,_dxil_spv::ThreadLocalAllocator<LLVMBC::AbbrevDesc>_>::
            size(&this_00->abbrevs);
    info._0_4_ = (uint32_t)info - (int)sVar4;
  }
  bVar1 = std::
          vector<LLVMBC::BlockContext_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockContext_*>_>::
          empty(&this->blockStack);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    uVar3 = (ulong)(uint32_t)info;
    ppBVar6 = std::
              vector<LLVMBC::BlockContext_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockContext_*>_>
              ::back(&this->blockStack);
    sVar4 = std::vector<LLVMBC::AbbrevDesc,_dxil_spv::ThreadLocalAllocator<LLVMBC::AbbrevDesc>_>::
            size(&(*ppBVar6)->abbrevs);
    if (uVar3 < sVar4) {
      ppBVar6 = std::
                vector<LLVMBC::BlockContext_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockContext_*>_>
                ::back(&this->blockStack);
      pvVar7 = std::vector<LLVMBC::AbbrevDesc,_dxil_spv::ThreadLocalAllocator<LLVMBC::AbbrevDesc>_>
               ::operator[](&(*ppBVar6)->abbrevs,(ulong)(uint32_t)info);
      return pvVar7;
    }
    __assert_fail("abbrevID < blockStack.back()->abbrevs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_decoder.cpp"
                  ,0x148,"const AbbrevDesc &LLVMBC::BitcodeReader::getAbbrev(uint32_t, uint32_t)");
  }
  __assert_fail("!blockStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_decoder.cpp"
                ,0x147,"const AbbrevDesc &LLVMBC::BitcodeReader::getAbbrev(uint32_t, uint32_t)");
}

Assistant:

const AbbrevDesc &BitcodeReader::getAbbrev(uint32_t blockId, uint32_t abbrevID)
{
  const BlockInfo *info = blockInfo[blockId];

  // IDs start at the first application specified ID. Rebase to that to get 0-base indices
  assert(abbrevID >= APPLICATION_ABBREV);
  abbrevID -= APPLICATION_ABBREV;

  if(info)
  {
    // IDs are first assigned to those permanently from BLOCKINFO
    if(abbrevID < info->abbrevs.size())
      return info->abbrevs[abbrevID];

    // block-local IDs start after the BLOCKINFO ones
    abbrevID -= (uint32_t)info->abbrevs.size();
  }

  assert(!blockStack.empty());
  assert(abbrevID < blockStack.back()->abbrevs.size());

  return blockStack.back()->abbrevs[abbrevID];
}